

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O3

Vec_Int_t * Wlc_NtkFindConflict(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues,int nFrames)

{
  uint uVar1;
  uint uVar2;
  word *pwVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Vec_Wec_t *p_00;
  Vec_Int_t *__ptr;
  int *piVar7;
  ulong uVar8;
  Vec_Int_t *vTrace;
  int *piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong local_40;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  __ptr = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = __ptr;
  if (vMemObjs->nSize * nFrames * 3 != vValues->nSize) {
    __assert_fail("3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x357,
                  "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)");
  }
  uVar1 = p->nObjsAlloc;
  if ((p->vCopies).nCap < (int)uVar1) {
    piVar7 = (p->vCopies).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar1 << 2);
    }
    (p->vCopies).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCopies).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCopies).nSize = uVar1;
  uVar8 = (ulong)(uint)vMemObjs->nSize;
  if (0 < vMemObjs->nSize) {
    piVar7 = vMemObjs->pArray;
    lVar13 = 0;
    do {
      iVar10 = piVar7[lVar13];
      if (((long)iVar10 < 0) || ((p->vCopies).nSize <= iVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar10] = (int)lVar13;
      lVar13 = lVar13 + 1;
      uVar8 = (ulong)vMemObjs->nSize;
    } while (lVar13 < (long)uVar8);
  }
  if (0 < nFrames) {
    local_40 = 0;
    iVar10 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar13 = 0;
LAB_0036053e:
        lVar11 = (long)vMemObjs->pArray[lVar13];
        if ((lVar11 < 1) || (p->nObjsAlloc <= vMemObjs->pArray[lVar13])) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        if ((undefined1  [24])((undefined1  [24])p->pObjs[lVar11] & (undefined1  [24])0x3f) !=
            (undefined1  [24])0x36) goto LAB_00360635;
        vTrace = Wlc_NtkTrace(p,p->pObjs + lVar11,iVar10,vMemObjs,vValues);
        iVar5 = Wlc_NtkTraceCheckConfict(p,vTrace,vMemObjs,vValues);
        if (iVar5 == 0) {
          Vec_WecPushLevel(p_00);
          local_40 = (ulong)p_00->nSize;
          if ((long)local_40 < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
          }
          __ptr = p_00->pArray;
          iVar5 = vTrace->nSize;
          piVar7 = vTrace->pArray;
          if ((long)iVar5 < 1) {
            if (piVar7 != (int *)0x0) goto LAB_0036060d;
          }
          else {
            lVar11 = 0;
            do {
              Vec_IntPush(__ptr + (local_40 - 1),piVar7[lVar11]);
              lVar11 = lVar11 + 1;
            } while (iVar5 != lVar11);
LAB_0036060d:
            free(piVar7);
          }
          free(vTrace);
          uVar8 = (ulong)(uint)vMemObjs->nSize;
          goto LAB_00360635;
        }
        iVar10 = p_00->nCap;
        if (0 < (long)iVar10) {
          lVar13 = 0;
          do {
            pvVar4 = *(void **)((long)&__ptr->pArray + lVar13);
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
              *(undefined8 *)((long)&__ptr->pArray + lVar13) = 0;
            }
            lVar13 = lVar13 + 0x10;
          } while ((long)iVar10 * 0x10 != lVar13);
          goto LAB_00360882;
        }
        if (__ptr != (Vec_Int_t *)0x0) goto LAB_00360882;
        goto LAB_0036088a;
      }
LAB_00360644:
      iVar10 = iVar10 + 1;
    } while (iVar10 != nFrames);
    if (0 < (int)local_40) {
      lVar13 = 0;
      uVar12 = 0;
      do {
        if (uVar12 != 0) {
          uVar1 = __ptr[uVar12].nSize;
          lVar11 = 0;
          do {
            if ((local_40 & 0xffffffff) << 4 == lVar11) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if (((int)uVar1 < 1) ||
               (lVar16 = (long)*(int *)((long)&__ptr->nSize + lVar11), lVar16 < 1))
            goto LAB_003609f0;
            piVar7 = __ptr[uVar12].pArray;
            piVar9 = *(int **)((long)&__ptr->pArray + lVar11);
            if (*piVar7 == *piVar9) {
              uVar17 = piVar7[(ulong)uVar1 - 1] >> 0xb;
              if (((int)uVar17 < 0) || (uVar2 = (p->vCopies).nSize, (int)uVar2 <= (int)uVar17)) {
LAB_003609f0:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar15 = piVar9[lVar16 + -1];
              uVar14 = (int)uVar15 >> 0xb;
              if (((int)uVar14 < 0) || (uVar2 <= uVar14)) goto LAB_003609f0;
              piVar9 = (p->vCopies).pArray;
              uVar2 = piVar9[uVar17];
              if (((int)uVar2 < 0) || (uVar6 = (uint)uVar8, (int)uVar6 <= (int)uVar2))
              goto LAB_003609f0;
              if (uVar17 != vMemObjs->pArray[uVar2]) {
                __assert_fail("iObj1 == Vec_IntEntry(vMemObjs, iNum1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x37b,
                              "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                             );
              }
              uVar17 = piVar9[uVar14];
              if (((int)uVar17 < 0) || (uVar6 <= uVar17)) goto LAB_003609f0;
              if (uVar14 != vMemObjs->pArray[uVar17]) {
                __assert_fail("iObj2 == Vec_IntEntry(vMemObjs, iNum2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                              ,0x37c,
                              "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                             );
              }
              iVar10 = ((uint)piVar7[(ulong)uVar1 - 1] >> 1 & 0x3ff) * uVar6 + uVar2;
              if (iVar10 < 0) {
LAB_00360a2e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                              ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
              }
              iVar10 = iVar10 * 3;
              uVar14 = iVar10 + 1;
              uVar2 = vValues->nSize;
              if (((int)uVar2 <= (int)uVar14) ||
                 (iVar5 = (uVar15 >> 1 & 0x3ff) * uVar6 + uVar17, iVar5 < 0)) goto LAB_00360a2e;
              iVar5 = iVar5 * 3;
              uVar17 = iVar5 + 1;
              if (uVar2 <= uVar17) goto LAB_00360a2e;
              pwVar3 = vValues->pArray;
              if (pwVar3[uVar14] == pwVar3[uVar17]) {
                uVar17 = iVar10 + 2;
                if ((uVar2 <= uVar17) || (uVar15 = iVar5 + 2, uVar2 <= uVar15)) goto LAB_00360a2e;
                if (pwVar3[uVar17] != pwVar3[uVar15]) {
                  vTrace = (Vec_Int_t *)malloc(0x10);
                  vTrace->nCap = 100;
                  vTrace->nSize = 0;
                  piVar9 = (int *)malloc(400);
                  vTrace->pArray = piVar9;
                  __ptr[uVar12].nSize = uVar1 - 1;
                  Vec_IntPush(vTrace,piVar7[uVar1 - 1]);
                  iVar10 = __ptr[uVar12].nSize;
                  if (iVar10 < 2) goto LAB_0036092c;
                  lVar13 = 1;
                  goto LAB_003608ef;
                }
              }
            }
            lVar11 = lVar11 + 0x10;
          } while (lVar13 != lVar11);
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x10;
      } while (uVar12 != (local_40 & 0xffffffff));
    }
  }
  Vec_WecFree(p_00);
  return (Vec_Int_t *)0x0;
LAB_00360635:
  lVar13 = lVar13 + 1;
  if ((int)uVar8 <= lVar13) goto LAB_00360644;
  goto LAB_0036053e;
LAB_003608ef:
  do {
    if (0 < (long)vTrace->nSize) {
      lVar16 = 0;
      do {
        if (vTrace->pArray[lVar16] == __ptr[uVar12].pArray[lVar13]) goto LAB_00360921;
        lVar16 = lVar16 + 1;
      } while (vTrace->nSize != lVar16);
    }
    Vec_IntPush(vTrace,__ptr[uVar12].pArray[lVar13]);
    iVar10 = __ptr[uVar12].nSize;
LAB_00360921:
    lVar13 = lVar13 + 1;
  } while (lVar13 < iVar10);
LAB_0036092c:
  iVar10 = *(int *)((long)&__ptr->nSize + lVar11);
  if (1 < iVar10) {
    lVar13 = 1;
    do {
      iVar5 = *(int *)(*(long *)((long)&__ptr->pArray + lVar11) + lVar13 * 4);
      if (0 < (long)vTrace->nSize) {
        lVar16 = 0;
        do {
          if (vTrace->pArray[lVar16] == iVar5) goto LAB_0036096e;
          lVar16 = lVar16 + 1;
        } while (vTrace->nSize != lVar16);
      }
      Vec_IntPush(vTrace,iVar5);
      iVar10 = *(int *)((long)&__ptr->nSize + lVar11);
LAB_0036096e:
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar10);
  }
  iVar10 = p_00->nCap;
  if (0 < (long)iVar10) {
    lVar13 = 0;
    do {
      pvVar4 = *(void **)((long)&__ptr->pArray + lVar13);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        *(undefined8 *)((long)&__ptr->pArray + lVar13) = 0;
      }
      lVar13 = lVar13 + 0x10;
    } while ((long)iVar10 * 0x10 != lVar13);
  }
LAB_00360882:
  free(__ptr);
LAB_0036088a:
  free(p_00);
  return vTrace;
}

Assistant:

Vec_Int_t * Wlc_NtkFindConflict( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, int nFrames )
{
    Wlc_Obj_t * pObj; int i, f, Entry;
    Vec_Wec_t * vTraces = Vec_WecAlloc( 100 );
    Vec_Int_t * vTrace, * vTrace1, * vTrace2;
    assert( 3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues) );
    Wlc_NtkCleanCopy( p );
    Vec_IntForEachEntry( vMemObjs, Entry, i )
        Wlc_ObjSetCopy( p, Entry, i );
    for ( f = 0; f < nFrames; f++ )
    {
        Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
        {
            if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
                continue;
            vTrace = Wlc_NtkTrace( p, pObj, f, vMemObjs, vValues );
            if ( Wlc_NtkTraceCheckConfict( p, vTrace, vMemObjs, vValues ) )
            {
                Vec_WecFree( vTraces );
                return vTrace;
            }
            Vec_WecPushLevel( vTraces );
            Vec_IntAppend( Vec_WecEntryLast(vTraces), vTrace );
            Vec_IntFree( vTrace );
        }
    }
    // check if there are any common read addresses
    Vec_WecForEachLevel( vTraces, vTrace1, i )
    Vec_WecForEachLevelStop( vTraces, vTrace2, f, i )
        if ( Vec_IntEntry(vTrace1, 0) == Vec_IntEntry(vTrace2, 0) )
        {
            int iObj1 = Vec_IntEntryLast(vTrace1) >> 11;
            int iFrm1 =(Vec_IntEntryLast(vTrace1) >> 1) & 0x3FF;
            int iNum1 = Wlc_ObjCopy( p, iObj1 );
            int iInd1 = 3*(iFrm1*Vec_IntSize(vMemObjs) + iNum1);

            int iObj2 = Vec_IntEntryLast(vTrace2) >> 11;
            int iFrm2 =(Vec_IntEntryLast(vTrace2) >> 1) & 0x3FF;
            int iNum2 = Wlc_ObjCopy( p, iObj2 );
            int iInd2 = 3*(iFrm2*Vec_IntSize(vMemObjs) + iNum2);

            assert( iObj1 == Vec_IntEntry(vMemObjs, iNum1) );
            assert( iObj2 == Vec_IntEntry(vMemObjs, iNum2) );
            if ( Vec_WrdEntry(vValues, iInd1 + 1) == Vec_WrdEntry(vValues, iInd2 + 1) &&  // equal address
                 Vec_WrdEntry(vValues, iInd1 + 2) != Vec_WrdEntry(vValues, iInd2 + 2) )   // diff data
            {
                vTrace = Vec_IntAlloc( 100 );
                Vec_IntPush( vTrace, Vec_IntPop(vTrace1) );
                Vec_IntForEachEntryStart( vTrace1, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_IntForEachEntryStart( vTrace2, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_WecFree( vTraces );
                return vTrace;
            }
        }
    Vec_WecFree( vTraces );
    return NULL;
}